

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::DeleteProperty
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  uint32 in_EAX;
  BOOL BVar4;
  BOOL BVar5;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  uint32 local_38;
  PropertyOperationFlags local_34;
  uint32 indexVal;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if (0 < this->propertyCount) {
    uVar8 = 0;
    do {
      uVar9 = uVar8 & 0xffff;
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar9 << 4)) + 8) ==
          propertyId) {
        bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar9 << 4));
        if ((bVar1 & 8) == 0) {
          if ((bVar1 & 2) == 0) {
            pPVar6 = ScriptContext::GetPropertyName(this_00,propertyId);
            JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                      (propertyOperationFlags,this_00,(PCWSTR)(pPVar6 + 1));
            return 0;
          }
          if ((((this->super_DynamicTypeHandler).flags & 0x20) != 0) ||
             (BVar5 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                                (&instance->super_RecyclableObject,propertyId), BVar5 != 0)) {
            ScriptContext::InvalidateProtoCaches(this_00,propertyId);
          }
          DynamicObject::ChangeType(instance);
          if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
            this = ConvertToNonSharedSimpleType(this,instance);
          }
          SetAttribute(this,instance,(PropertyIndex)uVar8,'\b');
          return 1;
        }
        if (((this->super_DynamicTypeHandler).flags & 4) == 0) {
          return 1;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x298,"(!GetIsLocked())","!GetIsLocked()");
        if (bVar3) {
          *puVar7 = 0;
          return 1;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      uVar8 = uVar9 + 1;
    } while ((uVar8 & 0xffff) < (uint)this->propertyCount);
  }
  local_38 = in_EAX;
  local_34 = propertyOperationFlags;
  bVar3 = DynamicObject::HasObjectArray(instance);
  BVar5 = 1;
  if ((bVar3) &&
     (BVar4 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38), BVar4 != 0)) {
    BVar5 = DynamicTypeHandler::DeleteItem
                      (&this->super_DynamicTypeHandler,instance,local_38,local_34);
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                return true;
            }
            if (!(descriptors[index].Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            if ((this->GetFlags() & IsPrototypeFlag)
                || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
            {
                // We don't evolve dictionary types when deleting a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.)
                scriptContext->InvalidateProtoCaches(propertyId);
            }

            instance->ChangeType();


            CompileAssert(_countof(descriptors) == size);
            if (size > 1)
            {
                if (GetIsLocked())
                {
                    // Prevent conversion to path type and then dictionary. Remove this when path types support deleted properties.
                    this->ConvertToNonSharedSimpleType(instance)->SetAttribute(instance, index, PropertyDeleted);
                }
                else
                {
                    SetAttribute(instance, index, PropertyDeleted);
                }
            }
            else
            {
                SetSlotUnchecked(instance, index, nullptr);

                NullTypeHandlerBase* nullTypeHandler = ((this->GetFlags() & IsPrototypeFlag) != 0) ?
                    (NullTypeHandlerBase*)NullTypeHandler<true>::GetDefaultInstance() : (NullTypeHandlerBase*)NullTypeHandler<false>::GetDefaultInstance();
                if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
                {
                    nullTypeHandler->ClearHasOnlyWritableDataProperties();
                }
                SetInstanceTypeHandler(instance, nullTypeHandler, false);
            }

            return true;
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::DeleteItem(instance, indexVal, propertyOperationFlags);
        }

        return true;
    }